

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cpp
# Opt level: O0

void __thiscall GrcManager::DebugClasses(GrcManager *this,char *pchOutputPath)

{
  byte bVar1;
  bool bVar2;
  _Ios_Openmode _Var3;
  char *pcVar4;
  char *in_RSI;
  ofstream strmOut;
  string staOutputFilename;
  allocator *sta2;
  undefined4 in_stack_fffffffffffffd68;
  undefined4 in_stack_fffffffffffffd6c;
  GdlObject *in_stack_fffffffffffffd70;
  int in_stack_fffffffffffffd7c;
  GrcErrorList *in_stack_fffffffffffffd80;
  allocator local_269;
  string local_268 [32];
  char local_248 [164];
  int in_stack_fffffffffffffe5c;
  vector<GdlGlyphClassDefn_*,_std::allocator<GdlGlyphClassDefn_*>_> *in_stack_fffffffffffffe60;
  ostream *in_stack_fffffffffffffe68;
  GdlRenderer *in_stack_fffffffffffffe70;
  allocator local_31;
  string local_30 [48];
  
  sta2 = &local_31;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,in_RSI,sta2);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  std::__cxx11::string::append((char *)local_30);
  std::ofstream::ofstream(local_248);
  _Var3 = std::__cxx11::string::data();
  std::ofstream::open(local_248,_Var3);
  bVar1 = std::ios::fail();
  if ((bVar1 & 1) == 0) {
    bVar2 = GrcErrorList::AnyFatalErrors(&g_errorList);
    if (bVar2) {
      std::operator<<((ostream *)local_248,"Fatal errors--compilation aborted");
    }
    else {
      GdlRenderer::DebugClasses
                (in_stack_fffffffffffffe70,in_stack_fffffffffffffe68,in_stack_fffffffffffffe60,
                 in_stack_fffffffffffffe5c);
    }
    std::ofstream::close();
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_268,"Error in writing to file ",&local_269);
    pcVar4 = (char *)std::__cxx11::string::data();
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&stack0xfffffffffffffd70,pcVar4,(allocator *)&stack0xfffffffffffffd6f);
    GrcErrorList::AddWarning
              (in_stack_fffffffffffffd80,in_stack_fffffffffffffd7c,in_stack_fffffffffffffd70,
               (string *)CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68),
               (string *)sta2);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffd70);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffd6f);
    std::__cxx11::string::~string(local_268);
    std::allocator<char>::~allocator((allocator<char> *)&local_269);
  }
  std::ofstream::~ofstream(local_248);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void GrcManager::DebugClasses(char * pchOutputPath)
{
	std::string staOutputFilename(pchOutputPath);
	staOutputFilename.append("/dbg_classes.txt");

	std::ofstream strmOut;
	strmOut.open(staOutputFilename.data());
	if (strmOut.fail())
	{
		g_errorList.AddWarning(6504, NULL,
			"Error in writing to file ", staOutputFilename.data());
		return;
	}

	if (g_errorList.AnyFatalErrors())
		strmOut << "Fatal errors--compilation aborted";
	else
	{
		m_prndr->DebugClasses(strmOut, m_vpglfcReplcmtClasses, m_cpglfcLinear);
	}

	strmOut.close();
}